

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O1

int mbedtls_ecp_gen_keypair_base
              (mbedtls_ecp_group *grp,mbedtls_ecp_point *G,mbedtls_mpi *d,mbedtls_ecp_point *Q,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  undefined4 in_EAX;
  int iVar1;
  undefined4 in_register_00000004;
  mbedtls_ecp_restart_ctx *rs_ctx;
  
  rs_ctx = (mbedtls_ecp_restart_ctx *)CONCAT44(in_register_00000004,in_EAX);
  iVar1 = mbedtls_ecp_gen_privkey(grp,d,f_rng,p_rng);
  if (iVar1 == 0) {
    iVar1 = mbedtls_ecp_mul_restartable(grp,Q,d,G,f_rng,p_rng,rs_ctx);
  }
  return iVar1;
}

Assistant:

int mbedtls_ecp_gen_keypair_base( mbedtls_ecp_group *grp,
                     const mbedtls_ecp_point *G,
                     mbedtls_mpi *d, mbedtls_ecp_point *Q,
                     int (*f_rng)(void *, unsigned char *, size_t),
                     void *p_rng )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    ECP_VALIDATE_RET( grp   != NULL );
    ECP_VALIDATE_RET( d     != NULL );
    ECP_VALIDATE_RET( G     != NULL );
    ECP_VALIDATE_RET( Q     != NULL );
    ECP_VALIDATE_RET( f_rng != NULL );

    MBEDTLS_MPI_CHK( mbedtls_ecp_gen_privkey( grp, d, f_rng, p_rng ) );
    MBEDTLS_MPI_CHK( mbedtls_ecp_mul( grp, Q, d, G, f_rng, p_rng ) );

cleanup:
    return( ret );
}